

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

void wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
     doVisitLocalSet(SpillPointers *self,Expression **currp)

{
  bool bVar1;
  Block *pBVar2;
  Module *pMVar3;
  Drop *pDVar4;
  LocalGet *pLVar5;
  LocalGet *get;
  Builder local_58;
  uintptr_t local_50;
  Expression *local_48;
  initializer_list<wasm::Expression_*> local_40;
  Builder local_30;
  Type local_28;
  Type originalType;
  LocalSet *curr;
  Expression **currp_local;
  SpillPointers *self_local;
  
  curr = (LocalSet *)currp;
  currp_local = (Expression **)self;
  originalType.id = (uintptr_t)Expression::cast<wasm::LocalSet>(*currp);
  if (currp_local[0x37] == (Expression *)0x0) {
    bVar1 = LocalSet::isTee((LocalSet *)originalType.id);
    if (bVar1) {
      local_28.id = *(uintptr_t *)(originalType.id + 8);
      bVar1 = wasm::Type::operator!=(&local_28,(Type *)(*(long *)(originalType.id + 0x18) + 8));
      if (bVar1) {
        pMVar3 = Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::getModule
                           ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                             *)(currp_local + 6));
        Builder::Builder(&local_30,pMVar3);
        local_48 = *(Expression **)(originalType.id + 0x18);
        local_40._M_array = &local_48;
        local_40._M_len = 1;
        local_50 = local_28.id;
        pBVar2 = Builder::makeBlock(&local_30,&local_40,local_28);
        *(Block **)&(curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression =
             pBVar2;
      }
      else {
        *(undefined8 *)&(curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression =
             *(undefined8 *)(originalType.id + 0x18);
      }
    }
    else {
      pMVar3 = Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::getModule
                         ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                          (currp_local + 6));
      Builder::Builder(&local_58,pMVar3);
      pDVar4 = Builder::makeDrop(&local_58,*(Expression **)(originalType.id + 0x18));
      *(Drop **)&(curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression = pDVar4
      ;
    }
  }
  else {
    get._4_4_ = 1;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               (currp_local[0x37] + 3),(What *)((long)&get + 4),
               &((LocalSet *)originalType.id)->index,(Expression ***)&curr);
    pLVar5 = getCopy((LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                      *)(currp_local + 6),(LocalSet *)originalType.id);
    if (pLVar5 != (LocalGet *)0x0) {
      addCopy((LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
              (currp_local + 6),*(Index *)(originalType.id + 0x10),pLVar5->index);
      addCopy((LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
              (currp_local + 6),*(Index *)(originalType.id + 0x10),pLVar5->index);
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalSet>();
    // if in unreachable code, we don't need the tee (but might need the value,
    // if it has side effects)
    if (!self->currBasicBlock) {
      if (curr->isTee()) {
        // We can remove the tee, but must leave something of the exact same
        // type.
        auto originalType = curr->type;
        if (originalType != curr->value->type) {
          *currp =
            Builder(*self->getModule()).makeBlock({curr->value}, originalType);
        } else {
          // No special handling, just use the value.
          *currp = curr->value;
        }
      } else {
        *currp = Builder(*self->getModule()).makeDrop(curr->value);
      }
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Set, curr->index, currp);
    // if this is a copy, note it
    if (auto* get = self->getCopy(curr)) {
      // add 2 units, so that backedge prioritization can decide ties, but not
      // much more
      self->addCopy(curr->index, get->index);
      self->addCopy(curr->index, get->index);
    }
  }